

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfstrmatrix.cpp
# Opt level: O2

int __thiscall
TPZFStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>::ClassId
          (TPZFStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
           *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZFStructMatrix",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZStructMatrixT<std::complex<double>_>::ClassId
                    (&this->super_TPZStructMatrixT<std::complex<double>_>);
  iVar3 = TPZStructMatrixTBBFlow<std::complex<double>_>::ClassId
                    ((TPZStructMatrixTBBFlow<std::complex<double>_> *)
                     &(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.
                      field_0xa0);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZFStructMatrix<TVar,TPar>::ClassId() const{
    return Hash("TPZFStructMatrix") ^
        TPZStructMatrixT<TVar>::ClassId() << 1 ^
        TPar::ClassId() << 2;
}